

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ply_type gvr::anon_unknown_3::PLYProperty::name2Type(string *name)

{
  int iVar1;
  ply_type pVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  pVar2 = ply_int8;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      pVar2 = ply_uint8;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)name);
          pVar2 = ply_int16;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)name);
              pVar2 = ply_uint16;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)name);
                  pVar2 = ply_int32;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)name);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)name);
                      pVar2 = ply_uint32;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)name);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)name);
                          pVar2 = ply_float32;
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)name);
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)name);
                              if (iVar1 == 0) {
                                pVar2 = ply_float64;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)name);
                                pVar2 = (uint)(iVar1 == 0) << 3;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pVar2;
}

Assistant:

ply_type PLYProperty::name2Type(const std::string &name)
{
  if (name == "int8" || name == "char")
  {
    return ply_int8;
  }
  else if (name == "uint8" || name == "uchar")
  {
    return ply_uint8;
  }
  else if (name == "int16" || name == "short")
  {
    return ply_int16;
  }
  else if (name == "uint16" || name == "ushort")
  {
    return ply_uint16;
  }
  else if (name == "int32" || name == "int")
  {
    return ply_int32;
  }
  else if (name == "uint32" || name == "uint")
  {
    return ply_uint32;
  }
  else if (name == "float32" || name == "float")
  {
    return ply_float32;
  }
  else if (name == "float64" || name == "double")
  {
    return ply_float64;
  }

  assert(false);

  return ply_none;
}